

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O0

string * __thiscall irr::scene::CB3DMeshFileLoader::readString_abi_cxx11_(CB3DMeshFileLoader *this)

{
  long lVar1;
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  c8 character;
  string *newstring;
  char local_13;
  allocator<char> local_12;
  undefined1 local_11;
  allocator<char> *__a;
  string *__s;
  
  local_11 = 0;
  __a = in_RSI;
  __s = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,__a);
  ::std::allocator<char>::~allocator(&local_12);
  while ((lVar1 = (**(code **)**(undefined8 **)(in_RSI + 0xd0))
                            (*(undefined8 **)(in_RSI + 0xd0),&local_13,1), lVar1 != 0 &&
         (local_13 != '\0'))) {
    ::std::__cxx11::string::push_back((char)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string CB3DMeshFileLoader::readString()
{
	std::string newstring = "";
	while (true) {
		c8 character;
		if (B3DFile->read(&character, sizeof(character)) == 0)
			break; // eof
		if (character == 0)
			break;
		newstring.push_back(character);
	}
	return newstring;
}